

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(void)

{
  time_t tVar1;
  PlayerMike_2 *pPVar2;
  allocator local_c1;
  PlayerMike_2 *local_c0;
  vector<Player_*,_std::allocator<Player_*>_> players;
  Tournament t;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"ROCK",&local_c1);
  PlayerConst::PlayerConst((PlayerConst *)pPVar2,(string *)&t,0);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"PAPER",&local_c1);
  PlayerConst::PlayerConst((PlayerConst *)pPVar2,(string *)&t,1);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"SCISSORS",&local_c1);
  PlayerConst::PlayerConst((PlayerConst *)pPVar2,(string *)&t,2);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"CONST_2",&local_c1);
  PlayerConst_2::PlayerConst_2((PlayerConst_2 *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"ALTERNATE",&local_c1);
  PlayerAlternate::PlayerAlternate((PlayerAlternate *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"CYCLE",&local_c1);
  PlayerCycle::PlayerCycle((PlayerCycle *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"CYCLE_2",&local_c1);
  PlayerCycle_2::PlayerCycle_2((PlayerCycle_2 *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"CYCLE_3",&local_c1);
  PlayerCycle_3::PlayerCycle_3((PlayerCycle_3 *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"COPY",&local_c1);
  PlayerCopy::PlayerCopy((PlayerCopy *)pPVar2,(string *)&t,0);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"NEXT",&local_c1);
  PlayerNext::PlayerNext((PlayerNext *)pPVar2,(string *)&t,0);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x28);
  std::__cxx11::string::string((string *)&t,"NEXT_2",&local_c1);
  PlayerNext_2::PlayerNext_2((PlayerNext_2 *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"ANTI_NEXT",&local_c1);
  PlayerAntiNext::PlayerAntiNext((PlayerAntiNext *)pPVar2,(string *)&t,0);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x38);
  std::__cxx11::string::string((string *)&t,"RANDOM_DIST",&local_c1);
  PlayerRandomDist::PlayerRandomDist((PlayerRandomDist *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x28);
  std::__cxx11::string::string((string *)&t,"RANDOM",&local_c1);
  PlayerRandom::PlayerRandom((PlayerRandom *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x30);
  std::__cxx11::string::string((string *)&t,"MIKE",&local_c1);
  PlayerMike::PlayerMike((PlayerMike *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x38);
  std::__cxx11::string::string((string *)&t,"ASK",&local_c1);
  PlayerAsk::PlayerAsk((PlayerAsk *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x60);
  std::__cxx11::string::string((string *)&t,"MIKE_2",&local_c1);
  PlayerMike_2::PlayerMike_2(pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x40);
  std::__cxx11::string::string((string *)&t,"MIKE_3",&local_c1);
  PlayerMike_3::PlayerMike_3((PlayerMike_3 *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x40);
  std::__cxx11::string::string((string *)&t,"MIKE_4",&local_c1);
  PlayerMike_4::PlayerMike_4((PlayerMike_4 *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x28);
  std::__cxx11::string::string((string *)&t,"MADS",&local_c1);
  PlayerMads::PlayerMads((PlayerMads *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x28);
  std::__cxx11::string::string((string *)&t,"DELAY",&local_c1);
  PlayerDelay::PlayerDelay((PlayerDelay *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x40);
  std::__cxx11::string::string((string *)&t,"ANTI_MIKE",&local_c1);
  PlayerAntiMike::PlayerAntiMike((PlayerAntiMike *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x28);
  std::__cxx11::string::string((string *)&t,"DELAY_2",&local_c1);
  PlayerDelay_2::PlayerDelay_2((PlayerDelay_2 *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x28);
  std::__cxx11::string::string((string *)&t,"TERMINATOR",&local_c1);
  PlayerTerminator::PlayerTerminator((PlayerTerminator *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  pPVar2 = (PlayerMike_2 *)operator_new(0x28);
  std::__cxx11::string::string((string *)&t,"DELAY_3",&local_c1);
  PlayerDelay_3::PlayerDelay_3((PlayerDelay_3 *)pPVar2,(string *)&t);
  local_c0 = pPVar2;
  std::vector<Player*,std::allocator<Player*>>::emplace_back<Player*>
            ((vector<Player*,std::allocator<Player*>> *)&players,(Player **)&local_c0);
  std::__cxx11::string::~string((string *)&t);
  Tournament::Tournament(&t,&players,1000);
  Tournament::play(&t);
  Tournament::showTable(&t);
  Tournament::show(&t);
  Tournament::~Tournament(&t);
  std::_Vector_base<Player_*,_std::allocator<Player_*>_>::~_Vector_base
            (&players.super__Vector_base<Player_*,_std::allocator<Player_*>_>);
  return 0;
}

Assistant:

int main()
{
   srand(time(0));

   std::vector<Player *> players;

   players.push_back(new PlayerConst(     "ROCK",       0));
   players.push_back(new PlayerConst(     "PAPER",      1));
   players.push_back(new PlayerConst(     "SCISSORS",   2));
   players.push_back(new PlayerConst_2(   "CONST_2"      ));
   players.push_back(new PlayerAlternate( "ALTERNATE"    ));
   players.push_back(new PlayerCycle(     "CYCLE"        ));
   players.push_back(new PlayerCycle_2(   "CYCLE_2"      ));
   players.push_back(new PlayerCycle_3(   "CYCLE_3"      ));
   players.push_back(new PlayerCopy(      "COPY",       0));
   players.push_back(new PlayerNext(      "NEXT",       0));
   players.push_back(new PlayerNext_2(    "NEXT_2"       ));
   players.push_back(new PlayerAntiNext(  "ANTI_NEXT",  0));
   players.push_back(new PlayerRandomDist("RANDOM_DIST"  ));
   players.push_back(new PlayerRandom(    "RANDOM"       ));
   players.push_back(new PlayerMike(      "MIKE"         ));
   players.push_back(new PlayerAsk(       "ASK"          ));
   players.push_back(new PlayerMike_2(    "MIKE_2"       ));
   players.push_back(new PlayerMike_3(    "MIKE_3"       ));
   players.push_back(new PlayerMike_4(    "MIKE_4"       ));
   players.push_back(new PlayerMads(      "MADS"         ));
   players.push_back(new PlayerDelay(     "DELAY"        ));
   players.push_back(new PlayerAntiMike(  "ANTI_MIKE"    ));
   players.push_back(new PlayerDelay_2 (  "DELAY_2"      ));
   players.push_back(new PlayerTerminator("TERMINATOR"   ));
   players.push_back(new PlayerDelay_3(   "DELAY_3"      ));
   Tournament t(players, numGames);
   
   t.play();

   t.showTable();
   t.show();
}